

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManBreakTies(Iso_Man_t *p,int fVerbose)

{
  int iVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  Iso_Obj_t *pIVar6;
  
  if (p->vClasses->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar5 = **p->vClasses->pArray & 0x3fffffff;
  if (fVerbose != 0) {
    printf("Best level %d\n",(ulong)uVar5);
  }
  lVar3 = (long)p->vClasses->nSize;
  if (0 < lVar3) {
    ppvVar2 = p->vClasses->pArray;
    lVar4 = 0;
    do {
      pIVar6 = (Iso_Obj_t *)ppvVar2[lVar4];
      if ((*(uint *)pIVar6 & 0x3fffffff) < uVar5) {
        return;
      }
      do {
        if (pIVar6->Id != 0) {
          __assert_fail("pTemp->Id == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                        ,0x424,"void Iso_ManBreakTies(Iso_Man_t *, int)");
        }
        iVar1 = p->nObjIds;
        p->nObjIds = iVar1 + 1;
        pIVar6->Id = iVar1;
        iVar1 = pIVar6->iClass;
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                        ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
        }
        if (iVar1 == 0) {
          pIVar6 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar6 = p->pObjs + iVar1;
        }
      } while (pIVar6 != (Iso_Obj_t *)0x0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3);
  }
  return;
}

Assistant:

void Iso_ManBreakTies( Iso_Man_t * p, int fVerbose )
{
    int fUseOneBest = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i, LevelStart = 0;
    pIso = (Iso_Obj_t *)Vec_PtrEntry( p->vClasses, 0 );
    LevelStart = pIso->Level;
    if ( fVerbose )
        printf( "Best level %d\n", LevelStart ); 
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( (int)pIso->Level < LevelStart )
            break;
        if ( !fUseOneBest )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            {
                assert( pTemp->Id ==  0 );
                pTemp->Id = p->nObjIds++;
            }
            continue;
        }
        if ( pIso->Level == 0 )//&& pIso->nFoutPos + pIso->nFoutNeg == 0 )
        {
            for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
                pTemp->Id = p->nObjIds++;
            continue;
        }
        pIso = Iso_ManFindBestObj( p, pIso );
        pIso->Id = p->nObjIds++;
    }
}